

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFPageDocumentHelper::flattenAnnotations
          (QPDFPageDocumentHelper *this,int required_flags,int forbidden_flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 this_00;
  element_type *peVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 page;
  QPDFAcroFormDocumentHelper afdh;
  string local_e0;
  QPDFPageDocumentHelper *local_c0;
  undefined1 local_b8 [24];
  element_type *peStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_78;
  int iStack_74;
  string local_70;
  QPDFAcroFormDocumentHelper local_50;
  
  local_c0 = this;
  local_78 = required_flags;
  iStack_74 = forbidden_flags;
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            (&local_50,(this->super_QPDFDocumentHelper).qpdf);
  bVar4 = QPDFAcroFormDocumentHelper::getNeedAppearances(&local_50);
  if (bVar4) {
    QPDF::getRoot((QPDF *)(local_b8 + 0x10));
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/AcroForm","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_b8,(string *)(local_b8 + 0x10));
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "document does not have updated appearance streams, so form fields will not be flattened"
               ,"");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_b8,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (peStack_a0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
    }
  }
  getAllPages((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_98,
              local_c0);
  uVar3 = local_98._8_8_;
  if (local_98._M_allocated_capacity != local_98._8_8_) {
    paVar1 = &local_e0.field_2;
    page = local_98._M_allocated_capacity;
    do {
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/Resources","");
      QPDFPageObjectHelper::getAttribute
                ((QPDFPageObjectHelper *)local_b8,(string *)page,SUB81(&local_e0,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_b8);
      if (!bVar4) {
        local_70._M_dataplus._M_p = *(pointer *)(page + 8);
        local_70._M_string_length =
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(page + 0x10))->_M_allocated_capacity;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_70._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_70._M_string_length)->_M_use_count + 1;
          }
        }
        local_e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/Resources","");
        QPDFObjectHandle::newDictionary();
        QPDFObjectHandle::replaceKeyAndGetNew
                  ((QPDFObjectHandle *)(local_b8 + 0x10),&local_70,(QPDFObjectHandle *)&local_e0);
        peVar2 = peStack_a0;
        local_b8._0_8_ = local_b8._16_8_;
        this_00 = local_b8._8_8_;
        local_b8._16_8_ = (element_type *)0x0;
        peStack_a0 = (element_type *)0x0;
        local_b8._8_8_ = peVar2;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          if (peStack_a0 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_a0);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.field_2._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
        }
      }
      flattenAnnotationsForPage
                (local_c0,(QPDFPageObjectHelper *)page,(QPDFObjectHandle *)local_b8,&local_50,
                 local_78,iStack_74);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      page = page + 0x38;
    } while (page != uVar3);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_98);
  bVar4 = QPDFAcroFormDocumentHelper::getNeedAppearances(&local_50);
  if (!bVar4) {
    QPDF::getRoot((QPDF *)&local_98._M_allocated_capacity);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/AcroForm","");
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_98,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_50);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotations(int required_flags, int forbidden_flags)
{
    QPDFAcroFormDocumentHelper afdh(this->qpdf);
    if (afdh.getNeedAppearances()) {
        this->qpdf.getRoot()
            .getKey("/AcroForm")
            .warnIfPossible(
                "document does not have updated appearance streams, so form fields "
                "will not be flattened");
    }
    for (auto& ph: getAllPages()) {
        QPDFObjectHandle resources = ph.getAttribute("/Resources", true);
        if (!resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper flatten resources missing or invalid");
            resources = ph.getObjectHandle().replaceKeyAndGetNew(
                "/Resources", QPDFObjectHandle::newDictionary());
        }
        flattenAnnotationsForPage(ph, resources, afdh, required_flags, forbidden_flags);
    }
    if (!afdh.getNeedAppearances()) {
        this->qpdf.getRoot().removeKey("/AcroForm");
    }
}